

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

bool __thiscall
helics::BrokerBase::sendToLogger
          (BrokerBase *this,GlobalFederateId federateID,int logLevel,string_view name,
          string_view message,bool fromRemote)

{
  string_view message_00;
  string_view header_00;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R9B;
  Time currentTime;
  string timeString;
  string header;
  bool noID;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  bool local_261;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdd0 [16];
  BrokerState state;
  BaseType local_21c;
  char *local_218;
  undefined8 local_210;
  undefined1 local_208 [32];
  char *local_1e8;
  LogManager *local_1e0;
  char *local_1d8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [84];
  BaseType local_144;
  byte local_13e;
  byte local_13d;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  GlobalFederateId local_11c;
  char *local_118 [2];
  undefined8 local_108;
  undefined1 in_stack_ffffffffffffff03;
  int in_stack_ffffffffffffff04;
  LogManager *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char **in_stack_ffffffffffffff18;
  LogManager *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined1 local_c8 [16];
  BaseType local_b8 [8];
  undefined8 local_98;
  undefined1 *local_90;
  char *local_88;
  undefined8 uStack_80;
  undefined1 *local_70;
  BaseType *local_68;
  basic_string_view<char,_std::char_traits<char>_> *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  BaseType BVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffffc8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  char *in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  
  state = in_stack_fffffffffffffdd0._14_2_;
  local_13d = in_R9B & 1;
  local_144 = (BaseType)
              CLI::std::atomic<helics::GlobalBrokerId>::load
                        ((atomic<helics::GlobalBrokerId> *)&in_RDI->_M_string_length,seq_cst);
  bVar1 = GlobalFederateId::operator!=(&local_11c,(GlobalBrokerId)local_144);
  local_261 = true;
  if (!bVar1) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_130);
    local_261 = false;
    if (!bVar1) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_130);
      local_261 = *pvVar2 == ']';
    }
  }
  local_13e = local_261;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  if ((local_13e & 1) != 0) {
    std::__cxx11::string::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60.internalTimeCode,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    goto LAB_0053284a;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  (**(code **)((in_RDI->_M_dataplus)._M_p + 0x48))();
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffd60.internalTimeCode,
             (double)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_1a8 = local_1a0;
  bVar1 = operator<=(in_stack_fffffffffffffd60,
                     (double)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  if (bVar1) {
LAB_005324e1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char)((ulong)in_stack_fffffffffffffd68 >> 0x38));
    getBrokerState((BrokerBase *)0x5324ff);
    brokerStateName_abi_cxx11_(state);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (char)((ulong)in_stack_fffffffffffffd68 >> 0x38));
  }
  else {
    local_1b0 = local_1a0;
    bVar1 = operator>=(in_stack_fffffffffffffd60,
                       (double)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    if (bVar1) goto LAB_005324e1;
    local_1e0 = (LogManager *)0x810484;
    local_1d8 = (char *)0x6;
    local_1e8 = (char *)TimeRepresentation::operator_cast_to_double
                                  ((TimeRepresentation<count_time<9,_long>_> *)0x532595);
    in_stack_ffffffffffffff18 = &local_1e8;
    in_stack_ffffffffffffffd8 = local_118;
    local_108 = 10;
    in_stack_ffffffffffffff04 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    in_stack_ffffffffffffff03 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x18);
    fmt.size_ = (size_t)in_stack_ffffffffffffffd8;
    fmt.data_ = local_1e8;
    args.desc_._4_4_ = in_stack_ffffffffffffffc4;
    args.desc_._0_4_ = in_stack_ffffffffffffffc0;
    args.field_1.args_ = in_stack_ffffffffffffffc8.args_;
    in_stack_ffffffffffffff08 = local_1e0;
    in_stack_ffffffffffffff10 = local_1d8;
    in_stack_ffffffffffffff20 = local_1e0;
    in_stack_ffffffffffffff28 = local_1d8;
    in_stack_ffffffffffffffd0 = local_1e8;
    local_118[0] = local_1e8;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(local_261,in_stack_fffffffffffffdb0),in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60.internalTimeCode);
  }
  local_218 = "{} ({}){}";
  local_210 = 9;
  local_21c = GlobalFederateId::baseValue(&local_11c);
  local_48 = local_208;
  local_58 = local_218;
  uStack_50 = local_210;
  local_60 = &local_130;
  local_68 = &local_21c;
  local_70 = local_198;
  local_88 = local_218;
  uStack_80 = local_210;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
            ((value<fmt::v11::context> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68);
  aVar4.values_ = (value<fmt::v11::context> *)local_b8;
  BVar3 = *local_68;
  local_b8[0] = BVar3;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            ((value<fmt::v11::context> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
            );
  local_90 = local_c8;
  local_98 = 0xd1d;
  fmt_00.size_ = (size_t)in_stack_ffffffffffffffd8;
  fmt_00.data_ = in_stack_ffffffffffffffd0;
  args_00.desc_._4_4_ = BVar3;
  args_00.desc_._0_4_ = in_stack_ffffffffffffffc0;
  args_00.field_1.values_ = aVar4.values_;
  ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(local_261,in_stack_fffffffffffffdb0),in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60.internalTimeCode);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60.internalTimeCode);
LAB_0053284a:
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x53285b);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60.internalTimeCode);
  header_00._M_str = in_stack_ffffffffffffff28;
  header_00._M_len = (size_t)in_stack_ffffffffffffff20;
  message_00._M_str = (char *)in_stack_ffffffffffffff18;
  message_00._M_len = (size_t)in_stack_ffffffffffffff10;
  bVar1 = LogManager::sendToLogger
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,header_00,message_00,
                     (bool)in_stack_ffffffffffffff03);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60.internalTimeCode);
  return bVar1;
}

Assistant:

bool BrokerBase::sendToLogger(GlobalFederateId federateID,
                              int logLevel,
                              std::string_view name,
                              std::string_view message,
                              bool fromRemote) const
{
    const bool noID = (federateID != global_id.load()) || (!name.empty() && name.back() == ']');

    std::string header;
    if (noID) {
        header = name;
    } else {
        std::string timeString;

        const Time currentTime = getSimulationTime();
        if (currentTime <= mInvalidSimulationTime || currentTime >= cHelicsBigNumber) {
            timeString.push_back('[');
            timeString.append(brokerStateName(getBrokerState()));
            timeString.push_back(']');
        } else {
            timeString = fmt::format("[t={}]", static_cast<double>(currentTime));
        }
        header = fmt::format("{} ({}){}", name, federateID.baseValue(), timeString);
    }
    return mLogManager->sendToLogger(logLevel, header, message, fromRemote);
}